

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlChar * xmlDictLookup(xmlDictPtr dict,xmlChar *name,int len)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  xmlDictEntryPtr local_80;
  xmlDictEntryPtr local_78;
  _xmlDictEntry *local_70;
  xmlDictEntryPtr tmp;
  unsigned_long skey;
  uint l;
  xmlChar *ret;
  xmlDictEntryPtr insert;
  xmlDictEntryPtr entry;
  unsigned_long nbi;
  unsigned_long okey;
  unsigned_long key;
  int len_local;
  xmlChar *name_local;
  xmlDictPtr dict_local;
  
  entry = (xmlDictEntryPtr)0x0;
  if ((dict == (xmlDictPtr)0x0) || (name == (xmlChar *)0x0)) {
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    skey._4_4_ = len;
    if (len < 0) {
      sVar3 = strlen((char *)name);
      skey._4_4_ = (uint)sVar3;
    }
    if (((dict->limit == 0) || ((ulong)skey._4_4_ < dict->limit)) && (skey._4_4_ < 0x40000000)) {
      if (dict->size == 0x80) {
        local_78 = (xmlDictEntryPtr)xmlDictComputeFastKey(name,skey._4_4_,dict->seed);
      }
      else {
        uVar1 = xmlDictComputeBigKey(name,skey._4_4_,dict->seed);
        local_78 = (xmlDictEntryPtr)(ulong)uVar1;
      }
      okey = (ulong)local_78 % dict->size;
      if (dict->dict[okey].valid == 0) {
        ret = (xmlChar *)0x0;
      }
      else {
        for (ret = (xmlChar *)(dict->dict + okey); *(long *)ret != 0; ret = *(xmlChar **)ret) {
          if (((*(xmlDictEntryPtr *)(ret + 0x18) == local_78) &&
              (*(uint *)(ret + 0x10) == skey._4_4_)) &&
             (iVar2 = memcmp(*(void **)(ret + 8),name,(ulong)skey._4_4_), iVar2 == 0)) {
            return *(xmlChar **)(ret + 8);
          }
          entry = (xmlDictEntryPtr)((long)&entry->next + 1);
        }
        if (((*(xmlDictEntryPtr *)(ret + 0x18) == local_78) && (*(uint *)(ret + 0x10) == skey._4_4_)
            ) && (iVar2 = memcmp(*(void **)(ret + 8),name,(ulong)skey._4_4_), iVar2 == 0)) {
          return *(xmlChar **)(ret + 8);
        }
      }
      if (dict->subdict != (_xmlDict *)0x0) {
        if (((dict->size == 0x80) && (dict->subdict->size != 0x80)) ||
           ((dict->size != 0x80 && (dict->subdict->size == 0x80)))) {
          if (dict->subdict->size == 0x80) {
            local_80 = (xmlDictEntryPtr)xmlDictComputeFastKey(name,skey._4_4_,dict->subdict->seed);
          }
          else {
            uVar1 = xmlDictComputeBigKey(name,skey._4_4_,dict->subdict->seed);
            local_80 = (xmlDictEntryPtr)(ulong)uVar1;
          }
          tmp = local_80;
        }
        else {
          tmp = local_78;
        }
        uVar4 = (ulong)tmp % dict->subdict->size;
        if (dict->subdict->dict[uVar4].valid != 0) {
          for (local_70 = dict->subdict->dict + uVar4; local_70->next != (_xmlDictEntry *)0x0;
              local_70 = local_70->next) {
            if ((((xmlDictEntryPtr)local_70->okey == tmp) && (local_70->len == skey._4_4_)) &&
               (iVar2 = memcmp(local_70->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
              return local_70->name;
            }
            entry = (xmlDictEntryPtr)((long)&entry->next + 1);
          }
          if ((((xmlDictEntryPtr)local_70->okey == tmp) && (local_70->len == skey._4_4_)) &&
             (iVar2 = memcmp(local_70->name,name,(ulong)skey._4_4_), iVar2 == 0)) {
            return local_70->name;
          }
        }
        okey = (ulong)local_78 % dict->size;
      }
      dict_local = (xmlDictPtr)xmlDictAddString(dict,name,skey._4_4_);
      if (dict_local == (xmlDictPtr)0x0) {
        dict_local = (xmlDictPtr)0x0;
      }
      else {
        if (ret == (xmlChar *)0x0) {
          insert = dict->dict + okey;
        }
        else {
          insert = (xmlDictEntryPtr)(*xmlMalloc)(0x20);
          if (insert == (xmlDictEntryPtr)0x0) {
            return (xmlChar *)0x0;
          }
        }
        insert->name = (xmlChar *)dict_local;
        insert->len = skey._4_4_;
        insert->next = (_xmlDictEntry *)0x0;
        insert->valid = 1;
        insert->okey = (unsigned_long)local_78;
        if (ret != (xmlChar *)0x0) {
          *(xmlDictEntryPtr *)ret = insert;
        }
        dict->nbElems = dict->nbElems + 1;
        if ((((xmlDictEntryPtr)0x3 < entry) && (dict->size < 0xaab)) &&
           (iVar2 = xmlDictGrow(dict,dict->size * 6), iVar2 != 0)) {
          dict_local = (xmlDictPtr)0x0;
        }
      }
    }
    else {
      dict_local = (xmlDictPtr)0x0;
    }
  }
  return (xmlChar *)dict_local;
}

Assistant:

const xmlChar *
xmlDictLookup(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey, nbi = 0;
    xmlDictEntryPtr entry;
    xmlDictEntryPtr insert;
    const xmlChar *ret;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;

    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	    nbi++;
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
		nbi++;
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
	key = okey % dict->size;
    }

    ret = xmlDictAddString(dict, name, l);
    if (ret == NULL)
        return(NULL);
    if (insert == NULL) {
	entry = &(dict->dict[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlDictEntry));
	if (entry == NULL)
	     return(NULL);
    }
    entry->name = ret;
    entry->len = l;
    entry->next = NULL;
    entry->valid = 1;
    entry->okey = okey;


    if (insert != NULL)
	insert->next = entry;

    dict->nbElems++;

    if ((nbi > MAX_HASH_LEN) &&
        (dict->size <= ((MAX_DICT_HASH / 2) / MAX_HASH_LEN))) {
	if (xmlDictGrow(dict, MAX_HASH_LEN * 2 * dict->size) != 0)
	    return(NULL);
    }
    /* Note that entry may have been freed at this point by xmlDictGrow */

    return(ret);
}